

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::ActionBlockSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ActionBlockSyntax *this,size_t index)

{
  __index_type _Var1;
  StatementSyntax *pSVar2;
  
  if (index == 1) {
    pSVar2 = (StatementSyntax *)this->elseClause;
  }
  else {
    if (index != 0) {
      parsing::Token::Token((Token *)__return_storage_ptr__);
      _Var1 = '\0';
      goto LAB_00303902;
    }
    pSVar2 = this->statement;
  }
  *(StatementSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pSVar2;
  _Var1 = '\x01';
LAB_00303902:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ActionBlockSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return statement;
        case 1: return elseClause;
        default: return nullptr;
    }
}